

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_> __thiscall
Parser::parseLambdaCallStatement(Parser *this)

{
  Mark *pMVar1;
  pointer this_00;
  _Head_base<0UL,_FunctionCallStatementNode_*,_false> in_RDI;
  string *in_stack_00000010;
  TokenType in_stack_0000001c;
  Parser *in_stack_00000020;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> lambdaCall;
  Mark mark;
  __single_object *node;
  bool in_stack_000000e7;
  Parser *in_stack_000000e8;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  Mark local_18 [3];
  
  pMVar1 = Tokenizer::getMark((Tokenizer *)0x16e919);
  local_18[0] = *pMVar1;
  parseLambdaCall(in_stack_000000e8,in_stack_000000e7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  expectToken(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator(&local_41);
  std::
  make_unique<FunctionCallStatementNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
            (in_stack_ffffffffffffffc8);
  this_00 = std::
            unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_>::
            operator->((unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_>
                        *)0x16e9a1);
  Node::setMark((Node *)this_00,local_18);
  std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr
            ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)in_RDI._M_head_impl
            );
  return (__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
          )(tuple<FunctionCallStatementNode_*,_std::default_delete<FunctionCallStatementNode>_>)
           in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<FunctionCallStatementNode> Parser::parseLambdaCallStatement()
{
  const auto mark = tokenizer_.getMark();
  auto lambdaCall = parseLambdaCall();
  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<FunctionCallStatementNode>(std::move(lambdaCall));
  node->setMark(mark);
  return node;
}